

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_command_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  Curl_easy *data_00;
  void *pvVar1;
  char *__s;
  size_t sVar2;
  size_t len;
  char *line;
  SMTP *smtp;
  Curl_easy *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  __s = (data_00->state).buffer;
  sVar2 = strlen(__s);
  if (((((*(long *)((long)pvVar1 + 0x10) == 0) || (smtpcode / 100 == 2)) || (smtpcode == 0x229)) ||
      (smtpcode == 1)) &&
     (((*(long *)((long)pvVar1 + 0x10) != 0 || (smtpcode / 100 == 2)) || (smtpcode == 1)))) {
    if (((data_00->set).opt_no_body & 1U) == 0) {
      __s[sVar2] = '\n';
      data._4_4_ = Curl_client_write(conn,1,__s,sVar2 + 1);
      __s[sVar2] = '\0';
    }
    if (smtpcode != 1) {
      if (*(long *)((long)pvVar1 + 0x10) == 0) {
        state(conn,SMTP_STOP);
      }
      else {
        *(undefined8 *)((long)pvVar1 + 0x10) = *(undefined8 *)(*(long *)((long)pvVar1 + 0x10) + 8);
        if (*(long *)((long)pvVar1 + 0x10) == 0) {
          state(conn,SMTP_STOP);
        }
        else {
          data._4_4_ = smtp_perform_command(conn);
        }
      }
    }
  }
  else {
    Curl_failf(data_00,"Command failed: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_RECV_ERROR;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_command_resp(struct connectdata *conn, int smtpcode,
                                        smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *line = data->state.buffer;
  size_t len = strlen(line);

  (void)instate; /* no use for this yet */

  if((smtp->rcpt && smtpcode/100 != 2 && smtpcode != 553 && smtpcode != 1) ||
     (!smtp->rcpt && smtpcode/100 != 2 && smtpcode != 1)) {
    failf(data, "Command failed: %d", smtpcode);
    result = CURLE_RECV_ERROR;
  }
  else {
    /* Temporarily add the LF character back and send as body to the client */
    if(!data->set.opt_no_body) {
      line[len] = '\n';
      result = Curl_client_write(conn, CLIENTWRITE_BODY, line, len + 1);
      line[len] = '\0';
    }

    if(smtpcode != 1) {
      if(smtp->rcpt) {
        smtp->rcpt = smtp->rcpt->next;

        if(smtp->rcpt) {
          /* Send the next command */
          result = smtp_perform_command(conn);
        }
        else
          /* End of DO phase */
          state(conn, SMTP_STOP);
      }
      else
        /* End of DO phase */
        state(conn, SMTP_STOP);
    }
  }

  return result;
}